

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor_test.cpp
# Opt level: O0

void __thiscall preprocessor_test_serial_Test::TestBody(preprocessor_test_serial_Test *this)

{
  bool bVar1;
  char *message;
  AssertionResult gtest_ar;
  char serial_id_b [32];
  char serial_id_a [32];
  AssertHelper local_78;
  Message local_70 [3];
  AssertionResult local_58;
  char local_48 [72];
  
  builtin_strncpy(local_48 + 0x30,"T_SERIAL_TAG186",0x10);
  builtin_strncpy(local_48 + 0x20,"PREPROCESSOR_TES",0x10);
  builtin_strncpy(local_48 + 0x10,"T_SERIAL_TAG188",0x10);
  builtin_strncpy(local_48,"PREPROCESSOR_TES",0x10);
  testing::internal::CmpHelperSTRNE
            ((internal *)&local_58,"serial_id_a","serial_id_b",local_48 + 0x20,local_48);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_58);
  if (!bVar1) {
    testing::Message::Message(local_70);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x110af1);
    testing::internal::AssertHelper::AssertHelper
              (&local_78,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/tests/preprocessor_test/source/preprocessor_test.cpp"
               ,0xbe,message);
    testing::internal::AssertHelper::operator=(&local_78,local_70);
    testing::internal::AssertHelper::~AssertHelper(&local_78);
    testing::Message::~Message((Message *)0x110b3f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x110b7f);
  return;
}

Assistant:

TEST_F(preprocessor_test, serial)
{
#define PREPROCSSOR_TEST_SERIAL_TAG abc

	const char serial_id_a[] = PREPROCESSOR_STRINGIFY(PREPROCESSOR_SERIAL_ID(PREPROCESSOR_TEST_SERIAL_TAG));

	const char serial_id_b[] = PREPROCESSOR_STRINGIFY(PREPROCESSOR_SERIAL_ID(PREPROCESSOR_TEST_SERIAL_TAG));

	EXPECT_STRNE(serial_id_a, serial_id_b);

#undef PREPROCESSOR_TEST_SERIAL_TAG
}